

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

wchar_t * ConvertToCLangFormat(wchar_t *format,ON_wStringBuffer *clang_format_buffer)

{
  bool bVar1;
  long lVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  wchar_t *pwVar6;
  
  lVar2 = 0;
  pwVar3 = format;
  do {
    wVar5 = *pwVar3;
    if (wVar5 == L'%') {
      wVar5 = pwVar3[1];
      if (wVar5 == L's') {
        lVar2 = lVar2 + 1;
        pwVar3 = pwVar3 + 2;
      }
      else {
        if (8 < (uint)(wVar5 + L'\xffffffcf')) {
          pwVar3 = pwVar3 + 1;
          goto LAB_005bdfb3;
        }
        pwVar3 = pwVar3 + 3;
        do {
          pwVar6 = pwVar3;
          pwVar3 = pwVar6 + 1;
        } while ((uint)(pwVar6[-1] + L'\xffffffd0') < 10);
        pwVar3 = pwVar6 + -1;
        if ((pwVar6[-1] == L'$') && (*pwVar6 == L's')) {
          lVar2 = lVar2 + 1;
          pwVar3 = pwVar6 + 1;
        }
      }
      wVar5 = *pwVar3;
    }
LAB_005bdfb3:
    pwVar3 = pwVar3 + 1;
  } while (wVar5 != L'\0');
  pwVar6 = format;
  if (((lVar2 != 0) &&
      (bVar1 = ON_wStringBuffer::GrowBuffer
                         (clang_format_buffer,lVar2 + ((long)pwVar3 - (long)format >> 2) + 1), bVar1
      )) && (pwVar3 = clang_format_buffer->m_buffer, pwVar4 = pwVar3, pwVar3 != (wchar_t *)0x0)) {
    do {
      wVar5 = *format;
      if (wVar5 == L'%') {
        *pwVar4 = L'%';
        wVar5 = format[1];
        if (wVar5 == L's') {
LAB_005be006:
          pwVar4[1] = L'l';
          pwVar6 = format + 1;
          format = format + 2;
          pwVar4[2] = *pwVar6;
          pwVar4 = pwVar4 + 3;
        }
        else {
          if (8 < (uint)(wVar5 + L'\xffffffcf')) {
            format = format + 1;
            pwVar4 = pwVar4 + 1;
            goto LAB_005be06d;
          }
          pwVar4[1] = wVar5;
          pwVar4 = pwVar4 + 2;
          pwVar6 = format + 2;
          format = format + 2;
          wVar5 = *pwVar6;
          while ((uint)(wVar5 + L'\xffffffd0') < 10) {
            *pwVar4 = wVar5;
            pwVar4 = pwVar4 + 1;
            pwVar6 = format + 1;
            format = format + 1;
            wVar5 = *pwVar6;
          }
          if ((wVar5 == L'$') && (format[1] == L's')) {
            *pwVar4 = L'$';
            goto LAB_005be006;
          }
        }
        wVar5 = *format;
      }
LAB_005be06d:
      format = format + 1;
      *pwVar4 = wVar5;
      pwVar4 = pwVar4 + 1;
      pwVar6 = pwVar3;
    } while (wVar5 != L'\0');
  }
  return pwVar6;
}

Assistant:

static const wchar_t* ConvertToCLangFormat(
  const wchar_t* format,
  ON_wStringBuffer& clang_format_buffer
  )
{
  size_t format_capacity = 0;
  const wchar_t* s;
  wchar_t c;

  s = format;
  for(;;)
  {
    if ('%' == *s)
    {
      s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        format_capacity++;
        s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        s++;
        while (*s >= '0' && *s <= '9')
          s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          format_capacity++;
          s++;
          s++;
        }
      }
    }
    if ( 0 == *s++ )
      break;
  }

  if (0 == format_capacity)
    return format;

  format_capacity += (s - format) + 1; // +1 for null terminator

  if ( !clang_format_buffer.GrowBuffer(format_capacity) )
    return format;

  wchar_t* ls = clang_format_buffer.m_buffer; 
  if ( nullptr == ls )
    return format;

  s = format;
  format = ls;
  for(;;)
  {
    if ('%' == *s)
    {
      *ls++ = *s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        *ls++ = 'l';
        *ls++ = *s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        *ls++ = *s++;
        while (*s >= '0' && *s <= '9')
          *ls++ = *s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          *ls++ = *s++;
          *ls++ = 'l';
          *ls++ = *s++;
        }
      }

    }
    if ( 0 == (*ls++ = *s++) )
      break;
  }

  return format;
}